

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O1

size_t __thiscall event_track::EventSample::size(EventSample *this)

{
  long lVar1;
  pointer pEVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  
  sVar6 = 8;
  if ((this->is_emeb_ == false) &&
     ((this->instance_boxes_).
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->instance_boxes_).
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pEVar2 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->instance_boxes_).
        super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
        ._M_impl.super__Vector_impl_data._M_finish == pEVar2) {
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      uVar4 = 0;
      uVar5 = 1;
      do {
        sVar3 = EventMessageInstanceBox::size(pEVar2 + uVar4);
        sVar6 = sVar6 + (sVar3 & 0xffffffff);
        pEVar2 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->instance_boxes_).
                       super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 3) *
                -0x7b425ed097b425ed;
        bVar7 = uVar5 <= uVar4;
        lVar1 = uVar4 - uVar5;
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar7 && lVar1 != 0);
    }
  }
  return sVar6;
}

Assistant:

std::size_t size()
		{
			if(is_emeb_ || instance_boxes_.size() == 0)
			   return 8;
			else 
			{
				size_t l_size = 0;

				for (uint32_t k = 0; k < instance_boxes_.size(); k++)
					l_size += (uint32_t)instance_boxes_[k].size();

				return l_size;
			}   
		}